

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjEncodeYUVPlanes(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                     uchar **dstPlanes,int *strides,int subsamp,int flags)

{
  JSAMPROW pJVar1;
  int iVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  JSAMPARRAY in_RDI;
  int in_R8D;
  int in_R9D;
  long *in_FS_OFFSET;
  long *in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  uchar *_tmpbuf2_aligned;
  uchar *_tmpbuf_aligned;
  j_compress_ptr cinfo;
  tjinstance *this;
  jpeg_component_info *compptr;
  JSAMPLE *ptr;
  int ph [10];
  int pw [10];
  int ph0;
  int pw0;
  int row;
  int retval;
  int i;
  JSAMPROW *outbuf [10];
  JSAMPROW *tmpbuf2 [10];
  JSAMPROW *tmpbuf [10];
  JSAMPLE *_tmpbuf2 [10];
  JSAMPLE *_tmpbuf [10];
  JSAMPROW *row_pointer;
  boolean in_stack_fffffffffffffd7c;
  j_compress_ptr in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  j_compress_ptr in_stack_fffffffffffffd90;
  ulong in_stack_fffffffffffffd98;
  j_compress_ptr in_stack_fffffffffffffda0;
  JSAMPARRAY ppJVar4;
  long local_240;
  int aiStack_238 [12];
  int aiStack_208 [11];
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long alStack_1c8 [10];
  long local_178 [10];
  long local_128 [10];
  long alStack_d8 [10];
  long alStack_88 [11];
  void *local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  local_30 = (void *)0x0;
  local_1d0 = 0;
  if (in_RDI == (JSAMPARRAY)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
    local_4 = -1;
  }
  else {
    *(undefined4 *)(in_RDI + 0xbf) = 0;
    *(undefined4 *)(in_RDI + 0xda) = 0;
    *(uint *)((long)in_RDI + 0x5fc) = (uint)(((uint)_tmpbuf2_aligned & 0x2000) != 0);
    for (local_1cc = 0; local_1cc < 10; local_1cc = local_1cc + 1) {
      local_128[local_1cc] = 0;
      alStack_88[local_1cc] = 0;
      local_178[local_1cc] = 0;
      alStack_d8[local_1cc] = 0;
      alStack_1c8[local_1cc] = 0;
    }
    ppJVar4 = in_RDI;
    local_20 = in_ECX;
    if (((ulong)in_RDI[0xc0] & 1) == 0) {
      snprintf((char *)(in_RDI + 0xc1),200,"%s",
               "tjEncodeYUVPlanes(): Instance has not been initialized for compression");
      *(undefined4 *)(ppJVar4 + 0xda) = 1;
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
               "tjEncodeYUVPlanes(): Instance has not been initialized for compression");
      local_1d0 = -1;
    }
    else if (((((((in_RSI == 0) || (in_EDX < 1)) || (in_ECX < 0)) || ((in_R8D < 1 || (in_R9D < 0))))
              || ((0xb < in_R9D || ((in_stack_00000008 == (long *)0x0 || (*in_stack_00000008 == 0)))
                  ))) || (in_stack_00000018 < 0)) || (5 < in_stack_00000018)) {
      snprintf((char *)(in_RDI + 0xc1),200,"%s","tjEncodeYUVPlanes(): Invalid argument");
      *(undefined4 *)(ppJVar4 + 0xda) = 1;
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjEncodeYUVPlanes(): Invalid argument");
      local_1d0 = -1;
    }
    else if ((in_stack_00000018 == 3) ||
            ((in_stack_00000008[1] != 0 && (in_stack_00000008[2] != 0)))) {
      if (in_R9D == 0xb) {
        snprintf((char *)(in_RDI + 0xc1),200,"%s",
                 "tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");
        *(undefined4 *)(ppJVar4 + 0xda) = 1;
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");
        local_1d0 = -1;
      }
      else {
        if (in_ECX == 0) {
          local_20 = in_EDX * tjPixelSize[in_R9D];
        }
        local_24 = in_R8D;
        local_1c = in_EDX;
        local_18 = in_RSI;
        iVar2 = _setjmp((__jmp_buf_tag *)(in_RDI + 0xa5));
        if (iVar2 == 0) {
          *(int *)(in_RDI + 6) = local_1c;
          *(int *)((long)in_RDI + 0x34) = local_24;
          if (((uint)_tmpbuf2_aligned & 8) == 0) {
            if (((uint)_tmpbuf2_aligned & 0x10) == 0) {
              if (((uint)_tmpbuf2_aligned & 0x20) != 0) {
                putenv("JSIMD_FORCESSE2=1");
              }
            }
            else {
              putenv("JSIMD_FORCESSE=1");
            }
          }
          else {
            putenv("JSIMD_FORCEMMX=1");
          }
          setCompDefaults(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                          in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                          (int)in_stack_fffffffffffffd80);
          if (*(int *)((long)in_RDI + 0x24) == 100) {
            (**(code **)(*in_RDI + 0x20))(in_RDI);
            jinit_c_master_control(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
            jinit_color_converter(in_stack_fffffffffffffd90);
            jinit_downsampler(in_stack_fffffffffffffd90);
            (**(code **)in_RDI[0x3b])(in_RDI);
            local_1d8 = (local_1c + *(int *)(in_RDI + 0x27)) - 1U &
                        (*(int *)(in_RDI + 0x27) - 1U ^ 0xffffffff);
            local_1dc = (local_24 + *(int *)((long)in_RDI + 0x13c)) - 1U &
                        (*(int *)((long)in_RDI + 0x13c) - 1U ^ 0xffffffff);
            local_30 = malloc((long)(int)local_1dc << 3);
            if (local_30 == (void *)0x0) {
              snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                       "tjEncodeYUVPlanes(): Memory allocation failure");
              *(undefined4 *)(ppJVar4 + 0xda) = 1;
              snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                       "tjEncodeYUVPlanes(): Memory allocation failure");
              local_1d0 = -1;
            }
            else {
              for (local_1cc = 0; local_1cc < local_24; local_1cc = local_1cc + 1) {
                if (((uint)_tmpbuf2_aligned & 2) == 0) {
                  *(long *)((long)local_30 + (long)local_1cc * 8) =
                       local_18 + (long)local_1cc * (long)local_20;
                }
                else {
                  *(long *)((long)local_30 + (long)local_1cc * 8) =
                       local_18 + (long)((local_24 - local_1cc) + -1) * (long)local_20;
                }
              }
              if (local_24 < (int)local_1dc) {
                for (local_1cc = local_24; local_1cc < (int)local_1dc; local_1cc = local_1cc + 1) {
                  *(undefined8 *)((long)local_30 + (long)local_1cc * 8) =
                       *(undefined8 *)((long)local_30 + (long)(local_24 + -1) * 8);
                }
              }
              for (local_1cc = 0; iVar2 = local_1cc, local_1cc < *(int *)((long)in_RDI + 0x4c);
                  local_1cc = local_1cc + 1) {
                pJVar1 = in_RDI[0xb];
                pvVar3 = malloc((ulong)(((uint)(*(int *)(pJVar1 + (long)local_1cc * 0x60 + 0x1c) *
                                                *(int *)(in_RDI + 0x27) * 8) /
                                         *(uint *)(pJVar1 + (long)local_1cc * 0x60 + 8) + 0x1f &
                                        0xffffffe0) * *(int *)((long)in_RDI + 0x13c) + 0x20));
                alStack_88[local_1cc] = (long)pvVar3;
                if (alStack_88[local_1cc] == 0) {
                  snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(ppJVar4 + 0xda) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  local_1d0 = -1;
                  goto LAB_0010ed7e;
                }
                pvVar3 = malloc((long)*(int *)((long)in_RDI + 0x13c) << 3);
                local_128[local_1cc] = (long)pvVar3;
                if (local_128[local_1cc] == 0) {
                  snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(ppJVar4 + 0xda) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  local_1d0 = -1;
                  goto LAB_0010ed7e;
                }
                for (local_1d4 = 0; local_1d4 < *(int *)((long)in_RDI + 0x13c);
                    local_1d4 = local_1d4 + 1) {
                  in_stack_fffffffffffffd90 =
                       (j_compress_ptr)(alStack_88[local_1cc] + 0x1fU & 0xffffffffffffffe0);
                  *(ulong *)(local_128[local_1cc] + (long)local_1d4 * 8) =
                       (long)in_stack_fffffffffffffd90->quant_tbl_ptrs +
                       ((ulong)(((uint)(*(int *)(pJVar1 + (long)iVar2 * 0x60 + 0x1c) *
                                        *(int *)(in_RDI + 0x27) * 8) /
                                 *(uint *)(pJVar1 + (long)iVar2 * 0x60 + 8) + 0x1f & 0xffffffe0) *
                               local_1d4) - 0x60);
                  in_stack_fffffffffffffda0 = in_stack_fffffffffffffd90;
                }
                pvVar3 = malloc((ulong)((*(int *)(pJVar1 + (long)iVar2 * 0x60 + 0x1c) * 8 + 0x1fU &
                                        0xffffffe0) * *(int *)(pJVar1 + (long)iVar2 * 0x60 + 0xc) +
                                       0x20));
                alStack_d8[local_1cc] = (long)pvVar3;
                if (alStack_d8[local_1cc] == 0) {
                  snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(ppJVar4 + 0xda) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  local_1d0 = -1;
                  goto LAB_0010ed7e;
                }
                pvVar3 = malloc((long)*(int *)(pJVar1 + (long)iVar2 * 0x60 + 0xc) << 3);
                local_178[local_1cc] = (long)pvVar3;
                if (local_178[local_1cc] == 0) {
                  snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(ppJVar4 + 0xda) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  local_1d0 = -1;
                  goto LAB_0010ed7e;
                }
                for (local_1d4 = 0; local_1d4 < *(int *)(pJVar1 + (long)iVar2 * 0x60 + 0xc);
                    local_1d4 = local_1d4 + 1) {
                  in_stack_fffffffffffffd98 = alStack_d8[local_1cc] + 0x1fU & 0xffffffffffffffe0;
                  *(ulong *)(local_178[local_1cc] + (long)local_1d4 * 8) =
                       in_stack_fffffffffffffd98 +
                       (*(int *)(pJVar1 + (long)iVar2 * 0x60 + 0x1c) * 8 + 0x1fU & 0xffffffe0) *
                       local_1d4;
                }
                aiStack_208[local_1cc] =
                     (int)(local_1d8 * *(int *)(pJVar1 + (long)iVar2 * 0x60 + 8)) /
                     *(int *)(in_RDI + 0x27);
                aiStack_238[local_1cc] =
                     (int)(local_1dc * *(int *)(pJVar1 + (long)iVar2 * 0x60 + 0xc)) /
                     *(int *)((long)in_RDI + 0x13c);
                pvVar3 = malloc((long)aiStack_238[local_1cc] << 3);
                alStack_1c8[local_1cc] = (long)pvVar3;
                if (alStack_1c8[local_1cc] == 0) {
                  snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(ppJVar4 + 0xda) = 1;
                  snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                           "tjEncodeYUVPlanes(): Memory allocation failure");
                  local_1d0 = -1;
                  goto LAB_0010ed7e;
                }
                local_240 = in_stack_00000008[local_1cc];
                for (local_1d4 = 0; local_1d4 < aiStack_238[local_1cc]; local_1d4 = local_1d4 + 1) {
                  *(long *)(alStack_1c8[local_1cc] + (long)local_1d4 * 8) = local_240;
                  if ((in_stack_00000010 == 0) ||
                     (*(int *)(in_stack_00000010 + (long)local_1cc * 4) == 0)) {
                    iVar2 = aiStack_208[local_1cc];
                  }
                  else {
                    iVar2 = *(int *)(in_stack_00000010 + (long)local_1cc * 4);
                  }
                  local_240 = local_240 + iVar2;
                }
              }
              iVar2 = _setjmp((__jmp_buf_tag *)(ppJVar4 + 0xa5));
              if (iVar2 == 0) {
                for (local_1d4 = 0; local_1d4 < (int)local_1dc;
                    local_1d4 = *(int *)((long)in_RDI + 0x13c) + local_1d4) {
                  (**(code **)(in_RDI[0x3b] + 8))
                            (in_RDI,(void *)((long)local_30 + (long)local_1d4 * 8),local_128,0,
                             *(undefined4 *)((long)in_RDI + 0x13c));
                  (**(code **)(in_RDI[0x3c] + 8))(in_RDI,local_128,0,local_178);
                  for (local_1cc = 0; local_1cc < *(int *)((long)in_RDI + 0x4c);
                      local_1cc = local_1cc + 1) {
                    jcopy_sample_rows(ppJVar4,(int)((ulong)in_RDI >> 0x20),
                                      (JSAMPARRAY)in_stack_fffffffffffffda0,
                                      (int)(in_stack_fffffffffffffd98 >> 0x20),
                                      (int)in_stack_fffffffffffffd98,
                                      (JDIMENSION)((ulong)in_stack_fffffffffffffd90 >> 0x20));
                  }
                }
                *(int *)(in_RDI + 0x26) = local_24 + *(int *)(in_RDI + 0x26);
                jpeg_abort_compress((j_compress_ptr)0x10ed7e);
              }
              else {
                local_1d0 = -1;
              }
            }
          }
          else {
            snprintf((char *)(ppJVar4 + 0xc1),200,"%s",
                     "tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
            *(undefined4 *)(ppJVar4 + 0xda) = 1;
            snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                     "tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
            local_1d0 = -1;
          }
        }
        else {
          local_1d0 = -1;
        }
      }
    }
    else {
      snprintf((char *)(in_RDI + 0xc1),200,"%s","tjEncodeYUVPlanes(): Invalid argument");
      *(undefined4 *)(ppJVar4 + 0xda) = 1;
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjEncodeYUVPlanes(): Invalid argument");
      local_1d0 = -1;
    }
LAB_0010ed7e:
    if (100 < *(int *)((long)in_RDI + 0x24)) {
      jpeg_abort_compress((j_compress_ptr)0x10ed93);
    }
    free(local_30);
    for (local_1cc = 0; local_1cc < 10; local_1cc = local_1cc + 1) {
      free((void *)local_128[local_1cc]);
      free((void *)alStack_88[local_1cc]);
      free((void *)local_178[local_1cc]);
      free((void *)alStack_d8[local_1cc]);
      free((void *)alStack_1c8[local_1cc]);
    }
    if (*(int *)(ppJVar4 + 0xbf) != 0) {
      local_1d0 = -1;
    }
    *(undefined4 *)((long)ppJVar4 + 0x5fc) = 0;
    local_4 = local_1d0;
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjEncodeYUVPlanes(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pitch, int height,
                                int pixelFormat, unsigned char **dstPlanes,
                                int *strides, int subsamp, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS], *_tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *outbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;

  GET_CINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;
    tmpbuf2[i] = NULL;  _tmpbuf2[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjEncodeYUVPlanes(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || !dstPlanes ||
      !dstPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjEncodeYUVPlanes(): Invalid argument");

  if (pixelFormat == TJPF_CMYK)
    THROW("tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  setCompDefaults(cinfo, pixelFormat, subsamp, -1, flags);

  /* Execute only the parts of jpeg_start_compress() that we need.  If we
     were to call the whole jpeg_start_compress() function, then it would try
     to write the file headers, which could overflow the output buffer if the
     YUV image were very small. */
  if (cinfo->global_state != CSTATE_START)
    THROW("tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  jinit_c_master_control(cinfo, FALSE);
  jinit_color_converter(cinfo);
  jinit_downsampler(cinfo);
  (*cinfo->cconvert->start_pass) (cinfo);

  pw0 = PAD(width, cinfo->max_h_samp_factor);
  ph0 = PAD(height, cinfo->max_v_samp_factor);

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjEncodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < cinfo->num_components; i++) {
    compptr = &cinfo->comp_info[i];
    _tmpbuf[i] = (JSAMPLE *)malloc(
      PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
          compptr->h_samp_factor, 32) *
      cinfo->max_v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] =
      (JSAMPROW *)malloc(sizeof(JSAMPROW) * cinfo->max_v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < cinfo->max_v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] = &_tmpbuf_aligned[
        PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
            compptr->h_samp_factor, 32) * row];
    }
    _tmpbuf2[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf2[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf2_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf2[i], 32);

      tmpbuf2[i][row] =
        &_tmpbuf2_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / cinfo->max_v_samp_factor;
    outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!outbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += cinfo->max_v_samp_factor) {
    (*cinfo->cconvert->color_convert) (cinfo, &row_pointer[row], tmpbuf, 0,
                                       cinfo->max_v_samp_factor);
    (cinfo->downsample->downsample) (cinfo, tmpbuf, 0, tmpbuf2, 0);
    for (i = 0, compptr = cinfo->comp_info; i < cinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(tmpbuf2[i], 0, outbuf[i],
        row * compptr->v_samp_factor / cinfo->max_v_samp_factor,
        compptr->v_samp_factor, pw[i]);
  }
  cinfo->next_scanline += height;
  jpeg_abort_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) jpeg_abort_compress(cinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(tmpbuf2[i]);
    free(_tmpbuf2[i]);
    free(outbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}